

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RecordSet::SetRecordValues
          (RecordSet *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *RV,KUINT16 RecCnt)

{
  size_type sVar1;
  byte local_1d;
  value_type_conflict local_1c;
  byte local_1b;
  KUINT16 local_1a;
  KUINT8 i;
  KUINT8 ui8Pad;
  KUINT8 ui8NumPadding;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  KUINT16 RecCnt_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *RV_local;
  RecordSet *this_local;
  
  this->m_ui16RecCnt = RecCnt;
  local_1a = RecCnt;
  pvStack_18 = RV;
  RV_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->m_vui8RecVals,RV);
  local_1b = (byte)((ulong)this->m_ui16RecLen % 4);
  local_1c = '\0';
  for (local_1d = 0; local_1d < local_1b; local_1d = local_1d + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8RecVals,&local_1c);
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_vui8RecVals);
  this->m_ui16RecLen = this->m_ui16RecLen + (short)sVar1 + 0xc;
  return;
}

Assistant:

void RecordSet::SetRecordValues( const vector<KUINT8> & RV, KUINT16 RecCnt )
{
    m_ui16RecCnt = RecCnt;
    m_vui8RecVals = RV;

    // Calculate padding to a 32 bit boundary.
    KUINT8 ui8NumPadding = m_ui16RecLen % 4;

    // Add the padding
    KUINT8 ui8Pad = 0;

    for( KUINT8 i = 0; i < ui8NumPadding; ++i )
    {
        m_vui8RecVals.push_back( ui8Pad );
    }

    m_ui16RecLen += RECORD_SET_SIZE + m_vui8RecVals.size();
}